

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraCodeBlocksGenerator::AppendTarget
          (cmExtraCodeBlocksGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmGeneratorTarget *target,char *make,cmLocalGenerator *lg,char *compiler)

{
  const_iterator __position;
  size_type sVar1;
  _Base_ptr *pp_Var2;
  int iVar3;
  TargetType TVar4;
  char *pcVar5;
  ostream *poVar6;
  char *pcVar7;
  cmExtraCodeBlocksGenerator *this_00;
  size_t sVar8;
  _Rb_tree_node_base *p_Var9;
  undefined8 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string systemIncludeDirs;
  string location;
  string buildType;
  string workingDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cdefs;
  string makefileName;
  undefined1 local_208 [32];
  _Base_ptr local_1e8;
  size_t local_1e0;
  undefined1 local_1d8 [36];
  allocator local_1b4;
  allocator local_1b3;
  allocator local_1b2;
  allocator local_1b1;
  string local_1b0;
  cmLocalGenerator *local_190;
  cmMakefile *local_188;
  cmGeneratedFileStream *local_180;
  string local_178;
  cmExtraCodeBlocksGenerator *local_158;
  char *local_150;
  string local_148;
  string local_128;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string *local_c0;
  undefined1 local_b8 [32];
  _Base_ptr *local_98 [2];
  _Base_ptr local_88 [2];
  cmGeneratorTarget *local_78;
  string local_70;
  string local_50;
  
  local_188 = lg->Makefile;
  local_158 = this;
  local_150 = make;
  local_c0 = targetName;
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
  std::__cxx11::string::string((string *)local_98,pcVar5,(allocator *)local_208);
  std::__cxx11::string::append((char *)local_98);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"      <Target title=\"",0x15);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\">\n",3);
  if (target == (cmGeneratorTarget *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"         <Option working_dir=\"",0x1e);
    pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)fout +
                      (int)(fout->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>
                           ._vptr_basic_ostream[-3]);
    }
    else {
      sVar8 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,pcVar5,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\" />\n",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"         <Option type=\"",0x17);
    poVar6 = (ostream *)std::ostream::operator<<(fout,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" />\n",5);
  }
  else {
    iVar3 = GetCBTargetType((cmExtraCodeBlocksGenerator *)poVar6,target);
    pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    std::__cxx11::string::string((string *)&local_128,pcVar5,(allocator *)local_208);
    local_180 = fout;
    TVar4 = cmGeneratorTarget::GetType(target);
    pcVar5 = local_208 + 0x10;
    if (TVar4 == EXECUTABLE) {
      local_208._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_208,"CMAKE_RUNTIME_OUTPUT_DIRECTORY","");
      pcVar7 = cmMakefile::GetDefinition(local_188,(string *)local_208);
      local_190 = (cmLocalGenerator *)CONCAT44(local_190._4_4_,iVar3);
      if ((char *)local_208._0_8_ != pcVar5) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
      }
      sVar1 = local_128._M_string_length;
      if (pcVar7 == (char *)0x0) {
        local_208._0_8_ = pcVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"EXECUTABLE_OUTPUT_PATH","");
        pcVar7 = cmMakefile::GetDefinition(local_188,(string *)local_208);
        iVar3 = (int)local_190;
        if ((char *)local_208._0_8_ != pcVar5) {
          operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
        }
        sVar1 = local_128._M_string_length;
        if (pcVar7 != (char *)0x0) {
          strlen(pcVar7);
          iVar3 = (int)local_190;
          std::__cxx11::string::_M_replace((ulong)&local_128,0,(char *)sVar1,(ulong)pcVar7);
        }
      }
      else {
        strlen(pcVar7);
        std::__cxx11::string::_M_replace((ulong)&local_128,0,(char *)sVar1,(ulong)pcVar7);
        iVar3 = (int)local_190;
      }
    }
    local_208._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"CMAKE_BUILD_TYPE","");
    this_00 = (cmExtraCodeBlocksGenerator *)
              cmMakefile::GetSafeDefinition(local_188,(string *)local_208);
    std::__cxx11::string::string((string *)&local_148,(char *)this_00,(allocator *)&local_178);
    if ((char *)local_208._0_8_ != pcVar5) {
      this_00 = (cmExtraCodeBlocksGenerator *)(local_208._16_8_ + 1);
      operator_delete((void *)local_208._0_8_,(ulong)this_00);
    }
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    TVar4 = cmGeneratorTarget::GetType(target);
    if (TVar4 == OBJECT_LIBRARY) {
      CreateDummyTargetFile_abi_cxx11_((string *)local_208,this_00,lg,target);
      std::__cxx11::string::operator=((string *)&local_178,(string *)local_208);
      if ((char *)local_208._0_8_ != pcVar5) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
      }
    }
    else {
      pcVar7 = cmGeneratorTarget::GetLocation(target,&local_148);
      sVar1 = local_178._M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)&local_178,0,(char *)sVar1,(ulong)pcVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"         <Option output=\"",0x19);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_180,local_178._M_dataplus._M_p,local_178._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "\" prefix_auto=\"0\" extension_auto=\"0\" />\n         <Option working_dir=\"",0x46)
    ;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_128._M_dataplus._M_p,local_128._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\" />\n         <Option object_output=\"./\" />\n         <Option type=\"",
               0x43);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\" />\n         <Option compiler=\"",0x20);
    if (compiler == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
    }
    else {
      sVar8 = strlen(compiler);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,compiler,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" />\n         <Compiler>\n",0x19);
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_d8._M_allocated_capacity = 0;
    local_208._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"C","");
    cmGeneratorTarget::GetCompileDefinitions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_e8,&local_148,(string *)local_208);
    local_190 = lg;
    local_78 = target;
    if ((char *)local_208._0_8_ != pcVar5) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if (local_e8._M_allocated_capacity != local_e8._8_8_) {
      uVar10 = local_e8._M_allocated_capacity;
      do {
        cmXMLSafe::cmXMLSafe((cmXMLSafe *)&local_1b0,*(char **)uVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_180,"            <Add option=\"-D",0x1b);
        cmXMLSafe::str_abi_cxx11_((string *)local_208,(cmXMLSafe *)&local_1b0);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_180,(char *)local_208._0_8_,
                            CONCAT44(local_208._12_4_,local_208._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" />\n",5);
        if ((char *)local_208._0_8_ != pcVar5) {
          operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
        }
        uVar10 = uVar10 + 0x20;
      } while (uVar10 != local_e8._8_8_);
    }
    __position._M_node = (_Base_ptr)(local_208 + 8);
    local_208._8_4_ = _S_red;
    local_208._16_8_ = 0;
    local_1e0 = 0;
    local_108._16_8_ = (pointer)0x0;
    local_108._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    local_208._24_8_ = __position._M_node;
    local_1e8 = __position._M_node;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"C","");
    cmLocalGenerator::GetIncludeDirectories
              (local_190,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_108,local_78,&local_1b0,&local_148,true);
    fout = local_180;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    uVar10 = local_108._8_8_;
    local_1b0._M_dataplus._M_p = local_208;
    if (local_108._0_8_ != local_108._8_8_) {
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
      ;
      local_1b0._M_dataplus._M_p = local_208;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_208,__position,pbVar11,(_Alloc_node *)&local_1b0);
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar10);
    }
    local_1d8._0_8_ = local_1d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS","");
    pcVar5 = cmMakefile::GetSafeDefinition(local_188,(string *)local_1d8);
    std::__cxx11::string::string((string *)&local_1b0,pcVar5,(allocator *)local_b8);
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    if ((char *)local_1b0._M_string_length != (char *)0x0) {
      local_1d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1d8._16_8_ = 0;
      cmSystemTools::ExpandListArgument
                (&local_1b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1d8,false);
      uVar10 = local_1d8._8_8_;
      local_b8._0_8_ =
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_208;
      if (local_1d8._0_8_ != local_1d8._8_8_) {
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1d8._0_8_;
        local_b8._0_8_ =
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_208;
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_208,__position,pbVar11,(_Alloc_node *)local_b8);
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar10);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
    }
    local_1d8._0_8_ = local_1d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS","");
    pcVar5 = cmMakefile::GetSafeDefinition(local_188,(string *)local_1d8);
    sVar1 = local_1b0._M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&local_1b0,0,(char *)sVar1,(ulong)pcVar5);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    p_Var9 = (_Rb_tree_node_base *)local_208._24_8_;
    if ((char *)local_1b0._M_string_length != (char *)0x0) {
      local_1d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1d8._16_8_ = 0;
      cmSystemTools::ExpandListArgument
                (&local_1b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1d8,false);
      uVar10 = local_1d8._8_8_;
      local_b8._0_8_ =
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_208;
      if (local_1d8._0_8_ != local_1d8._8_8_) {
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1d8._0_8_;
        local_b8._0_8_ =
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_208;
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_208,__position,pbVar11,(_Alloc_node *)local_b8);
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar10);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
      p_Var9 = (_Rb_tree_node_base *)local_208._24_8_;
    }
    for (; p_Var9 != __position._M_node;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)fout,"            <Add directory=\"",0x1c);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)fout,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" />\n",5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"         </Compiler>\n",0x15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                               local_178.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"         <MakeCommands>\n            <Build command=\"",0x34);
  std::__cxx11::string::string((string *)&local_128,local_150,&local_1b1);
  BuildMakeCommand((string *)local_208,local_158,&local_128,(char *)local_98[0],local_c0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(char *)local_208._0_8_,
                      CONCAT44(local_208._12_4_,local_208._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"\" />\n            <CompileFile command=\"",0x27);
  std::__cxx11::string::string((string *)&local_178,local_150,&local_1b2);
  pp_Var2 = local_98[0];
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"&quot;$file&quot;","");
  BuildMakeCommand(&local_148,local_158,&local_178,(char *)pp_Var2,&local_1b0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_148._M_dataplus._M_p,local_148._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"\" />\n            <Clean command=\"",0x21);
  std::__cxx11::string::string((string *)local_e8._M_local_buf,local_150,&local_1b3);
  pp_Var2 = local_98[0];
  local_108._0_8_ = (pointer)(local_108 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"clean","");
  BuildMakeCommand((string *)local_1d8,local_158,(string *)&local_e8,(char *)pp_Var2,
                   (string *)local_108);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_1d8._0_8_,local_1d8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"\" />\n            <DistClean command=\"",0x25);
  std::__cxx11::string::string((string *)&local_50,local_150,&local_1b4);
  pp_Var2 = local_98[0];
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"clean","");
  BuildMakeCommand((string *)local_b8,local_158,&local_50,(char *)pp_Var2,&local_70);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_b8._0_8_,local_b8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"\" />\n         </MakeCommands>\n      </Target>\n",0x2e);
  if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_b8._0_8_ !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_allocated_capacity != &local_d8) {
    operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],(ulong)((long)&local_88[0]->_M_color + 1));
  }
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::AppendTarget(cmGeneratedFileStream& fout,
                                              const std::string& targetName,
                                              cmGeneratorTarget* target,
                                              const char* make,
                                              const cmLocalGenerator* lg,
                                              const char* compiler)
{
  cmMakefile const* makefile = lg->GetMakefile();
  std::string makefileName = lg->GetCurrentBinaryDirectory();
  makefileName += "/Makefile";

  fout<<"      <Target title=\"" << targetName << "\">\n";
  if (target!=0)
    {
    int cbTargetType = this->GetCBTargetType(target);
    std::string workingDir = lg->GetCurrentBinaryDirectory();
    if ( target->GetType()==cmState::EXECUTABLE)
      {
      // Determine the directory where the executable target is created, and
      // set the working directory to this dir.
      const char* runtimeOutputDir = makefile->GetDefinition(
                                             "CMAKE_RUNTIME_OUTPUT_DIRECTORY");
      if (runtimeOutputDir != 0)
        {
        workingDir = runtimeOutputDir;
        }
      else
        {
        const char* executableOutputDir = makefile->GetDefinition(
                                                     "EXECUTABLE_OUTPUT_PATH");
        if (executableOutputDir != 0)
          {
          workingDir = executableOutputDir;
          }
        }
      }

    std::string buildType = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::string location;
    if ( target->GetType()==cmState::OBJECT_LIBRARY)
      {
      location = this->CreateDummyTargetFile(const_cast<cmLocalGenerator*>(lg),
                                             target);
      }
    else
      {
      location = target->GetLocation(buildType);
      }

    fout<<"         <Option output=\"" << location
                            << "\" prefix_auto=\"0\" extension_auto=\"0\" />\n"
          "         <Option working_dir=\"" << workingDir << "\" />\n"
          "         <Option object_output=\"./\" />\n"
          "         <Option type=\"" << cbTargetType << "\" />\n"
          "         <Option compiler=\"" << compiler << "\" />\n"
          "         <Compiler>\n";

    // the compilerdefines for this target
    std::vector<std::string> cdefs;
    target->GetCompileDefinitions(cdefs, buildType, "C");

    // Expand the list.
    for(std::vector<std::string>::const_iterator di = cdefs.begin();
        di != cdefs.end(); ++di)
      {
      cmXMLSafe safedef(di->c_str());
      fout <<"            <Add option=\"-D" << safedef.str() << "\" />\n";
      }

    // the include directories for this target
    std::set<std::string> uniqIncludeDirs;

    std::vector<std::string> includes;
    lg->GetIncludeDirectories(includes, target, "C", buildType);

    uniqIncludeDirs.insert(includes.begin(), includes.end());

    std::string systemIncludeDirs = makefile->GetSafeDefinition(
                              "CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty())
      {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      uniqIncludeDirs.insert(dirs.begin(), dirs.end());
      }

    systemIncludeDirs = makefile->GetSafeDefinition(
                            "CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty())
      {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      uniqIncludeDirs.insert(dirs.begin(), dirs.end());
      }

    for(std::set<std::string>::const_iterator dirIt=uniqIncludeDirs.begin();
        dirIt != uniqIncludeDirs.end();
        ++dirIt)
      {
      fout <<"            <Add directory=\"" << *dirIt << "\" />\n";
      }

    fout<<"         </Compiler>\n";
    }
  else // e.g. all and the GLOBAL and UTILITY targets
    {
    fout<<"         <Option working_dir=\""
        << lg->GetCurrentBinaryDirectory() << "\" />\n"
        <<"         <Option type=\"" << 4 << "\" />\n";
    }

  fout<<"         <MakeCommands>\n"
        "            <Build command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(), targetName)
      << "\" />\n"
        "            <CompileFile command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(),"&quot;$file&quot;")
      << "\" />\n"
        "            <Clean command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(), "clean")
      << "\" />\n"
        "            <DistClean command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(), "clean")
      << "\" />\n"
        "         </MakeCommands>\n"
        "      </Target>\n";

}